

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O3

Batch * __thiscall jaegertracing::thrift::Batch::operator=(Batch *this,Batch *other49)

{
  std::__cxx11::string::_M_assign((string *)&(this->process).serviceName);
  std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::operator=
            (&(this->process).tags,&(other49->process).tags);
  (this->process).__isset = (other49->process).__isset;
  std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::operator=
            (&this->spans,&other49->spans);
  return this;
}

Assistant:

Batch& Batch::operator=(const Batch& other49) {
  process = other49.process;
  spans = other49.spans;
  return *this;
}